

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::unlock
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this)

{
  COpenGLCacheHandler *pCVar1;
  STextureCache *this_00;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_RDI;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *prevTexture;
  ESetTextureActive in_stack_0000005c;
  ITexture *in_stack_00000060;
  u32 in_stack_0000006c;
  u32 in_stack_00000070;
  undefined4 in_stack_00000074;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *in_stack_00000078;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  if (in_RDI->LockImage != (IImage *)0x0) {
    if ((in_RDI->LockReadOnly & 1U) == 0) {
      pCVar1 = COpenGLDriver::getCacheHandler
                         (*(COpenGLDriver **)&(in_RDI->super_ITexture).field_0x78);
      this_00 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                ::getTextureCache(&pCVar1->
                                   super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                                 );
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::get(this_00,0);
      pCVar1 = COpenGLDriver::getCacheHandler
                         (*(COpenGLDriver **)&(in_RDI->super_ITexture).field_0x78);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::getTextureCache(&pCVar1->
                         super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       );
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_0000006c,
                 in_stack_00000060,in_stack_0000005c);
      getLockImageData(in_RDI,(uint)in_RDI->MipLevelStored);
      uploadTexture(in_stack_00000078,in_stack_00000074._3_1_,in_stack_00000070,in_stack_0000006c,
                    in_stack_00000060);
      pCVar1 = COpenGLDriver::getCacheHandler
                         (*(COpenGLDriver **)&(in_RDI->super_ITexture).field_0x78);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::getTextureCache(&pCVar1->
                         super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       );
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)CONCAT44(in_stack_00000074,in_stack_00000070),in_stack_0000006c,
                 in_stack_00000060,in_stack_0000005c);
    }
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
    in_RDI->LockReadOnly = false;
    in_RDI->LockImage = (IImage *)0x0;
    in_RDI->LockLayer = 0;
  }
  return;
}

Assistant:

void unlock() override
	{
		if (!LockImage)
			return;

		if (!LockReadOnly) {
			const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
			Driver->getCacheHandler()->getTextureCache().set(0, this);

			uploadTexture(false, LockLayer, MipLevelStored, getLockImageData(MipLevelStored));

			Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		}

		LockImage->drop();

		LockReadOnly = false;
		LockImage = 0;
		LockLayer = 0;
	}